

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<int>::SolveJacobi
          (TPZMatrix<int> *this,int64_t *numiterations,TPZFMatrix<int> *F,TPZFMatrix<int> *result,
          TPZFMatrix<int> *residual,TPZFMatrix<int> *scratch,REAL *tol,int FromCurrent)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (FromCurrent == 0) {
    TPZFMatrix<int>::operator=(scratch,F);
    (*(result->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (result);
  }
  else {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  iVar5 = Dot<int>(scratch,scratch);
  dVar4 = (double)iVar5;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (0 < *numiterations) {
    lVar2 = (F->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
    lVar8 = 0;
    do {
      if (ABS((double)(int)dVar4) < *tol || ABS((double)(int)dVar4) == *tol) break;
      if (0 < lVar2) {
        lVar11 = 0;
        lVar9 = 0;
        do {
          if (0 < CONCAT44(extraout_var,iVar5)) {
            lVar10 = 0;
            do {
              lVar3 = (scratch->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
              if ((lVar3 <= lVar10) ||
                 ((scratch->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar9)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              iVar7 = *(int *)((long)scratch->fElem + lVar10 * 4 + lVar3 * lVar11);
              iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                (this,lVar10,lVar10);
              lVar3 = (result->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
              if ((lVar3 <= lVar10) ||
                 ((result->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar9)) {
                TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              piVar1 = (int *)((long)result->fElem + lVar10 * 4 + lVar3 * lVar11);
              *piVar1 = *piVar1 + iVar7 / iVar6;
              lVar10 = lVar10 + 1;
            } while (CONCAT44(extraout_var,iVar5) != lVar10);
          }
          lVar9 = lVar9 + 1;
          lVar11 = lVar11 + 4;
        } while (lVar9 != lVar2);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
      iVar7 = Dot<int>(scratch,scratch);
      dVar4 = (double)iVar7;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < *numiterations);
  }
  if (residual != (TPZFMatrix<int> *)0x0) {
    TPZFMatrix<int>::operator=(residual,scratch);
    return;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}